

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  ConnectBits CVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  resolve_t rVar6;
  timediff_t tVar7;
  Curl_dns_entry *pCVar8;
  Curl_addrinfo *pCVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  curltime cVar13;
  curltime newer;
  curltime older;
  _Bool local_39;
  char *local_38;
  
  tVar7 = Curl_timeleft(data,(curltime *)0x0,true);
  pcVar11 = conn->unix_domain_socket;
  if (conn->unix_domain_socket == (char *)0x0) {
    if ((((ulong)conn->bits & 0x10) == 0) ||
       (pcVar10 = (conn->socks_proxy).host.name, pcVar10 == (char *)0x0)) {
      pcVar11 = (char *)0x0;
    }
    else {
      iVar5 = strncmp("localhost/",pcVar10,10);
      pcVar11 = (char *)0x0;
      if (iVar5 == 0) {
        pcVar11 = pcVar10 + 9;
      }
    }
  }
  if (pcVar11 == (char *)0x0) {
    CVar1 = conn->bits;
    if (((ulong)CVar1 & 0x10) == 0) {
      lVar12 = 0x88;
      if ((CVar1._0_4_ >> 8 & 1) == 0) {
        lVar12 = 0x58;
      }
      (conn->primary).remote_port =
           *(int *)((long)&conn->remote_port + (ulong)(CVar1._0_4_ >> 7 & 4));
      pcVar11 = "host";
    }
    else {
      lVar12 = 0xa8;
      if (((ulong)CVar1 & 2) == 0) {
        lVar12 = 0xe0;
      }
      pcVar11 = "proxy";
    }
    pcVar10 = (*Curl_cstrdup)(*(char **)((long)&(conn->cpool_node)._prev + lVar12));
    conn->hostname_resolve = pcVar10;
    if (pcVar10 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    local_38 = pcVar11;
    rVar6 = Curl_resolv_timeout(data,pcVar10,(conn->primary).remote_port,&conn->dns_entry,tVar7);
    if (rVar6 == CURLRESOLV_TIMEDOUT) {
      uVar2 = *(undefined8 *)((long)&(conn->cpool_node)._next + lVar12);
      cVar13 = Curl_now();
      uVar3 = (data->progress).t_startsingle.tv_sec;
      uVar4 = (data->progress).t_startsingle.tv_usec;
      older.tv_usec = uVar4;
      older.tv_sec = uVar3;
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar13._0_12_,0);
      newer.tv_usec = SUB124(cVar13._0_12_,8);
      older._12_4_ = 0;
      tVar7 = Curl_timediff(newer,older);
      Curl_failf(data,"Failed to resolve %s \'%s\' with timeout after %ld ms",local_38,uVar2,tVar7);
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (rVar6 != CURLRESOLV_PENDING) {
      if (conn->dns_entry == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Could not resolve %s: %s",local_38,
                   *(undefined8 *)((long)&(conn->cpool_node)._next + lVar12));
        return CURLE_COULDNT_RESOLVE_HOST;
      }
      return CURLE_OK;
    }
    *async = true;
  }
  else {
    conn->transport = '\x06';
    local_39 = false;
    pCVar8 = (Curl_dns_entry *)(*Curl_ccalloc)(1,0x20);
    if (pCVar8 == (Curl_dns_entry *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar9 = Curl_unix2addr(pcVar11,&local_39,
                            (_Bool)((byte)((uint)*(undefined4 *)&conn->bits >> 0x1a) & 1));
    pCVar8->addr = pCVar9;
    if (pCVar9 == (Curl_addrinfo *)0x0) {
      if (local_39 == true) {
        Curl_failf(data,"Unix socket path too long: \'%s\'",pcVar11);
      }
      (*Curl_cfree)(pCVar8);
      if (local_39 != false) {
        return CURLE_COULDNT_RESOLVE_HOST;
      }
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar8->refcount = 1;
    conn->dns_entry = pCVar8;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  struct hostname *ehost;
  timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);
  const char *peertype = "host";
  int rc;
#ifdef USE_UNIX_SOCKETS
  char *unix_path = conn->unix_domain_socket;

#ifndef CURL_DISABLE_PROXY
  if(!unix_path && CONN_IS_PROXIED(conn) && conn->socks_proxy.host.name &&
     !strncmp(UNIX_SOCKET_PREFIX"/",
              conn->socks_proxy.host.name, sizeof(UNIX_SOCKET_PREFIX)))
    unix_path = conn->socks_proxy.host.name + sizeof(UNIX_SOCKET_PREFIX) - 1;
#endif

  if(unix_path) {
    /* TODO, this only works if previous transport is TRNSPRT_TCP. Check it? */
    conn->transport = TRNSPRT_UNIX;
    return resolve_unix(data, conn, unix_path);
  }
#endif

  DEBUGASSERT(conn->dns_entry == NULL);

#ifndef CURL_DISABLE_PROXY
  if(CONN_IS_PROXIED(conn)) {
    ehost = conn->bits.socksproxy ? &conn->socks_proxy.host :
      &conn->http_proxy.host;
    peertype = "proxy";
  }
  else
#endif
  {
    ehost = conn->bits.conn_to_host ? &conn->conn_to_host : &conn->host;
    /* If not connecting via a proxy, extract the port from the URL, if it is
     * there, thus overriding any defaults that might have been set above. */
    conn->primary.remote_port = conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
  }

  /* Resolve target host right on */
  conn->hostname_resolve = strdup(ehost->name);
  if(!conn->hostname_resolve)
    return CURLE_OUT_OF_MEMORY;

  rc = Curl_resolv_timeout(data, conn->hostname_resolve,
                           conn->primary.remote_port,
                           &conn->dns_entry, timeout_ms);
  if(rc == CURLRESOLV_PENDING)
    *async = TRUE;
  else if(rc == CURLRESOLV_TIMEDOUT) {
    failf(data, "Failed to resolve %s '%s' with timeout after %"
          FMT_TIMEDIFF_T " ms", peertype, ehost->dispname,
          Curl_timediff(Curl_now(), data->progress.t_startsingle));
    return CURLE_OPERATION_TIMEDOUT;
  }
  else if(!conn->dns_entry) {
    failf(data, "Could not resolve %s: %s", peertype, ehost->dispname);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  return CURLE_OK;
}